

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Value * duckdb::Value::Numeric(Value *__return_storage_ptr__,LogicalType *type,int64_t value)

{
  uint8_t width;
  uint8_t scale;
  date_t value_00;
  unsigned_long uVar1;
  InvalidTypeException *this;
  uint *puVar2;
  hugeint_t value_01;
  uhugeint_t value_02;
  string local_68;
  uhugeint_t local_48;
  hugeint_t local_38;
  
  puVar2 = &switchD_00dd1b7e::switchdataD_01df4648;
  switch(type->id_) {
  case BOOLEAN:
    BOOLEAN(__return_storage_ptr__,value != 0);
    break;
  case TINYINT:
    TINYINT(__return_storage_ptr__,(uint8_t)value);
    break;
  case SMALLINT:
    SMALLINT(__return_storage_ptr__,(uint16_t)value);
    break;
  case INTEGER:
    INTEGER(__return_storage_ptr__,(uint32_t)value);
    break;
  case BIGINT:
    BIGINT(__return_storage_ptr__,value);
    break;
  case DATE:
    value_00.days = NumericCastImpl<int,_long,_false>::Convert(value);
    DATE(__return_storage_ptr__,value_00);
    break;
  case TIME:
    TIME(__return_storage_ptr__,(dtime_t)value);
    break;
  case TIMESTAMP_SEC:
    TIMESTAMPSEC(__return_storage_ptr__,(timestamp_sec_t)value);
    break;
  case TIMESTAMP_MS:
    TIMESTAMPMS(__return_storage_ptr__,(timestamp_ms_t)value);
    break;
  case TIMESTAMP:
    TIMESTAMP(__return_storage_ptr__,(timestamp_t)value);
    break;
  case TIMESTAMP_NS:
    TIMESTAMPNS(__return_storage_ptr__,(timestamp_ns_t)value);
    break;
  case DECIMAL:
    width = DecimalType::GetWidth(type);
    scale = DecimalType::GetScale(type);
    DECIMAL(__return_storage_ptr__,value,width,scale);
    break;
  case FLOAT:
    Value(__return_storage_ptr__,(float)value);
    break;
  case DOUBLE:
    Value(__return_storage_ptr__,(double)value);
    break;
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
switchD_00dd1b7e_caseD_18:
    this = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Numeric requires numeric type","");
    InvalidTypeException::InvalidTypeException(this,type,&local_68);
    __cxa_throw(this,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  case UTINYINT:
    UTINYINT(__return_storage_ptr__,(uint8_t)value);
    break;
  case USMALLINT:
    USMALLINT(__return_storage_ptr__,(uint16_t)value);
    break;
  case UINTEGER:
    UINTEGER(__return_storage_ptr__,(uint32_t)value);
    break;
  case UBIGINT:
    uVar1 = NumericCastImpl<unsigned_long,_long,_false>::Convert(value);
    UBIGINT(__return_storage_ptr__,uVar1);
    break;
  case TIMESTAMP_TZ:
    TIMESTAMPTZ(__return_storage_ptr__,(timestamp_tz_t)value);
    break;
  case UHUGEINT:
    uVar1 = NumericCastImpl<unsigned_long,_long,_false>::Convert(value);
    uhugeint_t::uhugeint_t(&local_48,uVar1);
    value_02.upper = (uint64_t)puVar2;
    value_02.lower = local_48.upper;
    UHUGEINT(__return_storage_ptr__,(Value *)local_48.lower,value_02);
    break;
  case HUGEINT:
    hugeint_t::hugeint_t(&local_38,value);
    value_01.upper = (int64_t)puVar2;
    value_01.lower = local_38.upper;
    HUGEINT(__return_storage_ptr__,(Value *)local_38.lower,value_01);
    break;
  case POINTER:
    uVar1 = NumericCastImpl<unsigned_long,_long,_false>::Convert(value);
    POINTER(__return_storage_ptr__,uVar1);
    break;
  default:
    if (type->id_ != ENUM) goto switchD_00dd1b7e_caseD_18;
    uVar1 = NumericCastImpl<unsigned_long,_long,_false>::Convert(value);
    ENUM(__return_storage_ptr__,uVar1,type);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::Numeric(const LogicalType &type, int64_t value) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		D_ASSERT(value == 0 || value == 1);
		return Value::BOOLEAN(value ? true : false);
	case LogicalTypeId::TINYINT:
		D_ASSERT(value >= NumericLimits<int8_t>::Minimum() && value <= NumericLimits<int8_t>::Maximum());
		return Value::TINYINT((int8_t)value);
	case LogicalTypeId::SMALLINT:
		D_ASSERT(value >= NumericLimits<int16_t>::Minimum() && value <= NumericLimits<int16_t>::Maximum());
		return Value::SMALLINT((int16_t)value);
	case LogicalTypeId::INTEGER:
		D_ASSERT(value >= NumericLimits<int32_t>::Minimum() && value <= NumericLimits<int32_t>::Maximum());
		return Value::INTEGER((int32_t)value);
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(value);
	case LogicalTypeId::UTINYINT:
		D_ASSERT(value >= NumericLimits<uint8_t>::Minimum() && value <= NumericLimits<uint8_t>::Maximum());
		return Value::UTINYINT((uint8_t)value);
	case LogicalTypeId::USMALLINT:
		D_ASSERT(value >= NumericLimits<uint16_t>::Minimum() && value <= NumericLimits<uint16_t>::Maximum());
		return Value::USMALLINT((uint16_t)value);
	case LogicalTypeId::UINTEGER:
		D_ASSERT(value >= NumericLimits<uint32_t>::Minimum() && value <= NumericLimits<uint32_t>::Maximum());
		return Value::UINTEGER((uint32_t)value);
	case LogicalTypeId::UBIGINT:
		D_ASSERT(value >= 0);
		return Value::UBIGINT(NumericCast<uint64_t>(value));
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(value);
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(NumericCast<uint64_t>(value));
	case LogicalTypeId::DECIMAL:
		return Value::DECIMAL(value, DecimalType::GetWidth(type), DecimalType::GetScale(type));
	case LogicalTypeId::FLOAT:
		return Value((float)value);
	case LogicalTypeId::DOUBLE:
		return Value((double)value);
	case LogicalTypeId::POINTER:
		return Value::POINTER(NumericCast<uintptr_t>(value));
	case LogicalTypeId::DATE:
		D_ASSERT(value >= NumericLimits<int32_t>::Minimum() && value <= NumericLimits<int32_t>::Maximum());
		return Value::DATE(date_t(NumericCast<int32_t>(value)));
	case LogicalTypeId::TIME:
		return Value::TIME(dtime_t(value));
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(timestamp_t(value));
	case LogicalTypeId::TIMESTAMP_SEC:
		return Value::TIMESTAMPSEC(timestamp_sec_t(value));
	case LogicalTypeId::TIMESTAMP_MS:
		return Value::TIMESTAMPMS(timestamp_ms_t(value));
	case LogicalTypeId::TIMESTAMP_NS:
		return Value::TIMESTAMPNS(timestamp_ns_t(value));
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(timestamp_tz_t(value));
	case LogicalTypeId::ENUM:
		return Value::ENUM(NumericCast<uint64_t>(value), type);
	default:
		throw InvalidTypeException(type, "Numeric requires numeric type");
	}
}